

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O1

void libtorrent::find_ip_address(int type,string_view string,ip_address_parse_state *state)

{
  int iVar1;
  undefined4 in_register_0000003c;
  error_code_parse_state *in_R8;
  size_type __rlen;
  string_view string_00;
  
  string_00._M_len = string._M_str;
  string_00._M_str = (char *)state;
  find_error_code((libtorrent *)CONCAT44(in_register_0000003c,type),(int)string._M_len,string_00,
                  in_R8);
  if ((state->super_error_code_parse_state).exit == false) {
    if (type == 4) {
      if (state->in_ip_address == true) {
        ::std::__cxx11::string::replace
                  ((ulong)&state->ip_address,0,(char *)(state->ip_address)._M_string_length,
                   (ulong)string_00._M_len);
        (state->super_error_code_parse_state).exit = true;
      }
    }
    else if (((type == 0) && (string._M_len == 0x14)) &&
            (iVar1 = bcmp(string_00._M_len,"NewExternalIPAddress",0x14), iVar1 == 0)) {
      state->in_ip_address = true;
    }
  }
  return;
}

Assistant:

void find_ip_address(int const type, string_view string, ip_address_parse_state& state)
{
	find_error_code(type, string, state);
	if (state.exit) return;

	if (type == xml_start_tag && string == "NewExternalIPAddress")
	{
		state.in_ip_address = true;
	}
	else if (type == xml_string && state.in_ip_address)
	{
		state.ip_address.assign(string.begin(), string.end());
		state.exit = true;
	}
}